

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resample_filters.cpp
# Opt level: O0

float crnlib::B_spline_filter(float t)

{
  undefined4 local_10;
  float tt;
  float t_local;
  
  local_10 = t;
  if (t < 0.0) {
    local_10 = -t;
  }
  if (1.0 <= local_10) {
    if (2.0 <= local_10) {
      tt = 0.0;
    }
    else {
      local_10 = 2.0 - local_10;
      tt = local_10 * local_10 * local_10 * 0.16666667;
    }
  }
  else {
    tt = local_10 * local_10 * 0.5 * local_10 + -(local_10 * local_10) + 0.6666667;
  }
  return tt;
}

Assistant:

static float B_spline_filter(float t) /* box (*) box (*) box (*) box */
    {
        float tt;

        if (t < 0.0f)
        {
            t = -t;
        }

        if (t < 1.0f)
        {
            tt = t * t;
            return ((.5f * tt * t) - tt + (2.0f / 3.0f));
        }
        else if (t < 2.0f)
        {
            t = 2.0f - t;
            return ((1.0f / 6.0f) * (t * t * t));
        }

        return (0.0f);
    }